

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModelPrivate::layoutChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_1,
          LayoutChangeHint hint)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  QPersistentModelIndex *this_01;
  QItemSelection *this_02;
  QItemSelection *this_03;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this_04;
  QList<QPersistentModelIndex> *this_05;
  int iVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this_06;
  QList<QPersistentModelIndex> *this_07;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->tableSelected == true) {
    iVar1 = this->tableColCount;
    this_00 = &this->model;
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(this_00);
    pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
    this_01 = &this->tableParent;
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
    iVar4 = (*(pQVar2->super_QObject)._vptr_QObject[0x10])(pQVar2,&local_58);
    if (iVar1 == iVar4) {
      iVar1 = this->tableRowCount;
      QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
      ::value(this_00);
      pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
      QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
      iVar4 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,&local_78);
      if (iVar1 == iVar4) {
        QList<QItemSelectionRange>::clear(&(this->ranges).super_QList<QItemSelectionRange>);
        QList<QItemSelectionRange>::clear
                  (&(this->currentSelection).super_QList<QItemSelectionRange>);
        iVar1 = this->tableColCount;
        iVar4 = this->tableRowCount;
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])(&local_58,pQVar2,0,0,&local_78);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(this_00);
        pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
        QPersistentModelIndex::operator_cast_to_QModelIndex(this_01);
        (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                  (&local_78,pQVar2,(ulong)(iVar4 - 1),(ulong)(iVar1 - 1),&local_90);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_90,&local_58,&local_78);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  (&(this->currentSelection).super_QList<QItemSelectionRange>,
                   (QItemSelectionRange *)&local_90);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_90);
        local_90.r = -1;
        local_90.c = -1;
        local_90.i = 0;
        local_90.m.ptr = (QAbstractItemModel *)0x0;
        QPersistentModelIndex::operator=(this_01,&local_90);
        this->tableSelected = false;
        goto LAB_004022aa;
      }
    }
  }
  if (hint == VerticalSortHint) {
    if ((this->savedPersistentRowLengths).d.size == 0) {
      lVar3 = (this->savedPersistentCurrentRowLengths).d.size;
joined_r0x0040212b:
      if (lVar3 == 0) goto LAB_004022aa;
    }
  }
  else if ((this->savedPersistentCurrentIndexes).d.size == 0) {
    lVar3 = (this->savedPersistentIndexes).d.size;
    goto joined_r0x0040212b;
  }
  this_02 = &this->ranges;
  QList<QItemSelectionRange>::clear(&this_02->super_QList<QItemSelectionRange>);
  this_03 = &this->currentSelection;
  QList<QItemSelectionRange>::clear(&this_03->super_QList<QItemSelectionRange>);
  if (hint == VerticalSortHint) {
    this_04 = &this->savedPersistentRowLengths;
    iVar5 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin(this_04);
    iVar6 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end(this_04);
    std::
    __stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i);
    this_06 = &this->savedPersistentCurrentRowLengths;
    iVar5 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin(this_06);
    iVar6 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end(this_06);
    std::
    __stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar5.i,iVar6.i);
    mergeRowLengths((QItemSelection *)&local_58,this_04);
    QArrayDataPointer<QItemSelectionRange>::operator=
              ((QArrayDataPointer<QItemSelectionRange> *)this_02,
               (QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    mergeRowLengths((QItemSelection *)&local_58,this_06);
    QArrayDataPointer<QItemSelectionRange>::operator=
              ((QArrayDataPointer<QItemSelectionRange> *)this_03,
               (QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(this_04);
    QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear(this_06);
  }
  else {
    this_05 = &this->savedPersistentIndexes;
    iVar7 = QList<QPersistentModelIndex>::begin(this_05);
    iVar8 = QList<QPersistentModelIndex>::end(this_05);
    std::
    __stable_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
              (iVar7,iVar8,
               (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                )0x402adc);
    this_07 = &this->savedPersistentCurrentIndexes;
    iVar7 = QList<QPersistentModelIndex>::begin(this_07);
    iVar8 = QList<QPersistentModelIndex>::end(this_07);
    std::
    __stable_sort<QList<QPersistentModelIndex>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>>
              (iVar7,iVar8,
               (_Iter_comp_iter<bool_(*)(const_QPersistentModelIndex_&,_const_QPersistentModelIndex_&)>
                )0x402adc);
    mergeIndexes((QItemSelection *)&local_58,this_05);
    QArrayDataPointer<QItemSelectionRange>::operator=
              ((QArrayDataPointer<QItemSelectionRange> *)this_02,
               (QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    mergeIndexes((QItemSelection *)&local_58,this_07);
    QArrayDataPointer<QItemSelectionRange>::operator=
              ((QArrayDataPointer<QItemSelectionRange> *)this_03,
               (QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
    QList<QPersistentModelIndex>::clear(this_05);
    QList<QPersistentModelIndex>::clear(this_07);
  }
LAB_004022aa:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::layoutChanged(const QList<QPersistentModelIndex> &, QAbstractItemModel::LayoutChangeHint hint)
{
    // special case for when all indexes are selected
    if (tableSelected && tableColCount == model->columnCount(tableParent)
        && tableRowCount == model->rowCount(tableParent)) {
        ranges.clear();
        currentSelection.clear();
        int bottom = tableRowCount - 1;
        int right = tableColCount - 1;
        QModelIndex tl = model->index(0, 0, tableParent);
        QModelIndex br = model->index(bottom, right, tableParent);
        currentSelection << QItemSelectionRange(tl, br);
        tableParent = QModelIndex();
        tableSelected = false;
        return;
    }

    if ((hint != QAbstractItemModel::VerticalSortHint && savedPersistentCurrentIndexes.isEmpty() && savedPersistentIndexes.isEmpty())
     || (hint == QAbstractItemModel::VerticalSortHint && savedPersistentRowLengths.isEmpty() && savedPersistentCurrentRowLengths.isEmpty())) {
        // either the selection was actually empty, or we
        // didn't get the layoutAboutToBeChanged() signal
        return;
    }

    // clear the "old" selection
    ranges.clear();
    currentSelection.clear();

    if (hint != QAbstractItemModel::VerticalSortHint) {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentIndexes.begin(), savedPersistentIndexes.end(),
                         qt_PersistentModelIndexLessThan);
        std::stable_sort(savedPersistentCurrentIndexes.begin(), savedPersistentCurrentIndexes.end(),
                         qt_PersistentModelIndexLessThan);

        // update the selection by merging the individual indexes
        ranges = mergeIndexes(savedPersistentIndexes);
        currentSelection = mergeIndexes(savedPersistentCurrentIndexes);

        // release the persistent indexes
        savedPersistentIndexes.clear();
        savedPersistentCurrentIndexes.clear();
    } else {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentRowLengths.begin(), savedPersistentRowLengths.end());
        std::stable_sort(savedPersistentCurrentRowLengths.begin(), savedPersistentCurrentRowLengths.end());

        // update the selection by merging the individual indexes
        ranges = mergeRowLengths(savedPersistentRowLengths);
        currentSelection = mergeRowLengths(savedPersistentCurrentRowLengths);

        // release the persistent indexes
        savedPersistentRowLengths.clear();
        savedPersistentCurrentRowLengths.clear();
    }
}